

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Value * __thiscall toml::internal::Parser::parseGroupKey(Parser *this,Value *root)

{
  size_type *psVar1;
  TokenType TVar2;
  _Rb_tree_color _Var3;
  pointer pcVar4;
  long lVar5;
  anon_union_8_8_51f126cb_for_Value_2 aVar6;
  iterator iVar7;
  Value *this_00;
  ulong uVar8;
  _Base_ptr p_Var9;
  _Base_ptr this_01;
  char cVar10;
  bool bVar11;
  string key;
  undefined1 local_98 [8];
  pointer pVStack_90;
  _Base_ptr local_88;
  _Base_ptr p_Stack_80;
  _Base_ptr local_78;
  size_t sStack_70;
  Value local_68;
  TokenType local_54;
  key_type local_50;
  
  if ((this->token_).type_ == LBRACKET) {
    nextKey(this);
    local_54 = (this->token_).type_;
    if (local_54 == LBRACKET) {
      nextKey(this);
    }
    do {
      if (1 < (this->token_).type_ - IDENT) {
        return (Value *)0x0;
      }
      pcVar4 = (this->token_).str_value_._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,pcVar4 + (this->token_).str_value_._M_string_length);
      nextKey(this);
      TVar2 = (this->token_).type_;
      cVar10 = '\x01';
      p_Var9 = (_Base_ptr)root;
      if (TVar2 == RBRACKET) {
        nextKey(this);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                        *)((_Base_ptr)root)->_M_parent,&local_50);
        this_01 = iVar7._M_node + 2;
        if (iVar7._M_node == (_Base_ptr)&((_Base_ptr)root)->_M_parent->_M_parent) {
          if (local_54 == LBRACKET) {
            local_98 = (undefined1  [8])0x0;
            pVStack_90 = (pointer)0x0;
            local_88 = (_Base_ptr)0x0;
            local_68.type_ = ARRAY_TYPE;
            local_68.field_1.null_ = operator_new(0x18);
            ((local_68.field_1.array_)->
            super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_98;
            (local_68.field_1.string_)->_M_string_length = (size_type)pVStack_90;
            ((local_68.field_1.array_)->
            super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_88;
            local_98 = (undefined1  [8])0x0;
            pVStack_90 = (pointer)0x0;
            local_88 = (_Base_ptr)0x0;
            this_00 = Value::setChild(root,&local_50,&local_68);
            Value::~Value(&local_68);
            std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector
                      ((vector<toml::Value,_std::allocator<toml::Value>_> *)local_98);
            local_88 = (_Base_ptr)0x0;
            local_98 = (undefined1  [8])0x0;
            pVStack_90 = (pointer)0x0;
            p_Stack_80 = (_Base_ptr)&pVStack_90;
            sStack_70 = 0;
            local_68.type_ = TABLE_TYPE;
            local_78 = p_Stack_80;
            local_68.field_1.null_ = operator_new(0x30);
            psVar1 = &(local_68.field_1.string_)->_M_string_length;
            *(undefined4 *)&(local_68.field_1.string_)->_M_string_length = 0;
            if (local_88 == (_Base_ptr)0x0) {
              ((local_68.field_1.array_)->
              super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(size_type **)((long)&(local_68.field_1.string_)->field_2 + 8) = psVar1;
              ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)psVar1;
              aVar6.null_ = local_68.field_1.null_;
            }
            else {
              ((local_68.field_1.array_)->
              super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)local_88;
              *(_Base_ptr *)((long)&(local_68.field_1.string_)->field_2 + 8) = p_Stack_80;
              ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_78;
              ((anon_union_8_8_51f126cb_for_Value_2 *)&local_88->_M_parent)->null_ = psVar1;
              ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
                   sStack_70;
              local_88 = (_Base_ptr)0x0;
              p_Stack_80 = (_Base_ptr)&pVStack_90;
              aVar6.null_ = local_98;
              local_78 = p_Stack_80;
            }
            ((aVar6.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
            p_Var9 = (_Base_ptr)Value::push(this_00,&local_68);
          }
          else {
            local_88 = (_Base_ptr)0x0;
            local_98 = (undefined1  [8])0x0;
            pVStack_90 = (pointer)0x0;
            p_Stack_80 = (_Base_ptr)&pVStack_90;
            sStack_70 = 0;
            local_68.type_ = TABLE_TYPE;
            local_78 = p_Stack_80;
            local_68.field_1.null_ = operator_new(0x30);
            psVar1 = &(local_68.field_1.string_)->_M_string_length;
            *(undefined4 *)&(local_68.field_1.string_)->_M_string_length = 0;
            if (local_88 == (_Base_ptr)0x0) {
              ((local_68.field_1.array_)->
              super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(size_type **)((long)&(local_68.field_1.string_)->field_2 + 8) = psVar1;
              ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)psVar1;
              aVar6.null_ = local_68.field_1.null_;
            }
            else {
              ((local_68.field_1.array_)->
              super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)local_88;
              *(_Base_ptr *)((long)&(local_68.field_1.string_)->field_2 + 8) = p_Stack_80;
              ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_78;
              ((anon_union_8_8_51f126cb_for_Value_2 *)&local_88->_M_parent)->null_ = psVar1;
              ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
                   sStack_70;
              local_88 = (_Base_ptr)0x0;
              p_Stack_80 = (_Base_ptr)&pVStack_90;
              aVar6.null_ = local_98;
              local_78 = p_Stack_80;
            }
            ((aVar6.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
            p_Var9 = (_Base_ptr)Value::setChild(root,&local_50,&local_68);
          }
LAB_0015af6d:
          Value::~Value(&local_68);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                       *)local_98);
          cVar10 = '\x03';
        }
        else {
          _Var3 = this_01->_M_color;
          uVar8 = (ulong)_Var3;
          if (local_54 == LBRACKET) {
            if (_Var3 == 6) {
              local_88 = (_Base_ptr)0x0;
              local_98 = (undefined1  [8])0x0;
              pVStack_90 = (pointer)0x0;
              p_Stack_80 = (_Base_ptr)&pVStack_90;
              sStack_70 = 0;
              local_68.type_ = TABLE_TYPE;
              local_78 = p_Stack_80;
              local_68.field_1.null_ = operator_new(0x30);
              psVar1 = &(local_68.field_1.string_)->_M_string_length;
              *(undefined4 *)&(local_68.field_1.string_)->_M_string_length = 0;
              if (local_88 == (_Base_ptr)0x0) {
                ((local_68.field_1.array_)->
                super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                *(size_type **)((long)&(local_68.field_1.string_)->field_2 + 8) = psVar1;
                ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                     (_Base_ptr)psVar1;
                aVar6.null_ = local_68.field_1.null_;
              }
              else {
                ((local_68.field_1.array_)->
                super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)local_88;
                *(_Base_ptr *)((long)&(local_68.field_1.string_)->field_2 + 8) = p_Stack_80;
                ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_78;
                ((anon_union_8_8_51f126cb_for_Value_2 *)&local_88->_M_parent)->null_ = psVar1;
                ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
                     sStack_70;
                local_88 = (_Base_ptr)0x0;
                p_Stack_80 = (_Base_ptr)&pVStack_90;
                aVar6.null_ = local_98;
                local_78 = p_Stack_80;
              }
              ((aVar6.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
              p_Var9 = (_Base_ptr)Value::push((Value *)this_01,&local_68);
              goto LAB_0015af6d;
            }
          }
          else {
            if ((_Var3 == 6) &&
               ((iVar7._M_node[2]._M_parent)->_M_parent != *(_Base_ptr *)iVar7._M_node[2]._M_parent)
               ) {
              if (uVar8 != 0) {
                uVar8 = (long)(iVar7._M_node[2]._M_parent)->_M_parent -
                        *(long *)iVar7._M_node[2]._M_parent >> 4;
              }
              lVar5 = *(long *)iVar7._M_node[2]._M_parent;
              if (uVar8 - 1 < (ulong)((long)(iVar7._M_node[2]._M_parent)->_M_parent - lVar5 >> 4)) {
                this_01 = (_Base_ptr)(lVar5 + (uVar8 - 1) * 0x10);
              }
              else {
                this_01 = (_Base_ptr)0x0;
              }
            }
            bVar11 = this_01->_M_color == 7;
            p_Var9 = this_01;
            if (!bVar11) {
              p_Var9 = (_Base_ptr)root;
            }
            cVar10 = bVar11 * '\x02' + '\x01';
          }
        }
      }
      else if (TVar2 == DOT) {
        nextKey(this);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                        *)((_Base_ptr)root)->_M_parent,&local_50);
        p_Var9 = iVar7._M_node + 2;
        if (iVar7._M_node == (_Base_ptr)&((_Base_ptr)root)->_M_parent->_M_parent) {
          local_88 = (_Base_ptr)0x0;
          local_98 = (undefined1  [8])0x0;
          pVStack_90 = (pointer)0x0;
          p_Stack_80 = (_Base_ptr)&pVStack_90;
          sStack_70 = 0;
          local_68.type_ = TABLE_TYPE;
          local_78 = p_Stack_80;
          local_68.field_1.null_ = operator_new(0x30);
          psVar1 = &(local_68.field_1.string_)->_M_string_length;
          *(undefined4 *)&(local_68.field_1.string_)->_M_string_length = 0;
          if (local_88 == (_Base_ptr)0x0) {
            ((local_68.field_1.array_)->
            super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *(size_type **)((long)&(local_68.field_1.string_)->field_2 + 8) = psVar1;
            ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)psVar1;
            aVar6.null_ = local_68.field_1.null_;
          }
          else {
            ((local_68.field_1.array_)->
            super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_88;
            *(_Base_ptr *)((long)&(local_68.field_1.string_)->field_2 + 8) = p_Stack_80;
            ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_78;
            ((anon_union_8_8_51f126cb_for_Value_2 *)&local_88->_M_parent)->null_ = psVar1;
            ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
                 sStack_70;
            local_88 = (_Base_ptr)0x0;
            p_Stack_80 = (_Base_ptr)&pVStack_90;
            aVar6.null_ = local_98;
            local_78 = p_Stack_80;
          }
          ((aVar6.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
          p_Var9 = (_Base_ptr)Value::setChild(root,&local_50,&local_68);
          Value::~Value(&local_68);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                       *)local_98);
          cVar10 = '\x02';
        }
        else {
          if ((p_Var9->_M_color == 6) &&
             ((iVar7._M_node[2]._M_parent)->_M_parent != *(_Base_ptr *)iVar7._M_node[2]._M_parent))
          {
            uVar8 = ((long)(iVar7._M_node[2]._M_parent)->_M_parent -
                     *(long *)iVar7._M_node[2]._M_parent >> 4) - 1;
            lVar5 = *(long *)iVar7._M_node[2]._M_parent;
            if (uVar8 < (ulong)((long)(iVar7._M_node[2]._M_parent)->_M_parent - lVar5 >> 4)) {
              p_Var9 = (_Base_ptr)(lVar5 + uVar8 * 0x10);
            }
            else {
              p_Var9 = (_Base_ptr)0x0;
            }
          }
          bVar11 = p_Var9->_M_color == 7;
          if (!bVar11) {
            p_Var9 = (_Base_ptr)root;
          }
          cVar10 = bVar11 + '\x01';
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      root = (Value *)p_Var9;
    } while (cVar10 == '\x02');
    if (cVar10 == '\x03') {
      if (local_54 == LBRACKET) {
        if ((this->token_).type_ != RBRACKET) {
          return (Value *)0x0;
        }
        nextKey(this);
      }
      if ((this->token_).type_ - END_OF_FILE < 2) {
        nextKey(this);
        return (Value *)p_Var9;
      }
    }
  }
  return (Value *)0x0;
}

Assistant:

inline bool Parser::consumeForKey(TokenType type)
{
    if (token().type() == type) {
        nextKey();
        return true;
    }

    return false;
}